

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int brtrimws(bstring b)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ushort **ppuVar5;
  ulong uVar6;
  uchar *puVar7;
  ulong uVar8;
  
  iVar3 = -1;
  iVar4 = -1;
  if (((b != (bstring)0x0) && (puVar7 = b->data, iVar4 = iVar3, puVar7 != (uchar *)0x0)) &&
     (iVar3 = b->mlen, 0 < iVar3)) {
    uVar1 = b->slen;
    if (((int)uVar1 <= iVar3) && (-1 < (int)uVar1)) {
      uVar6 = (ulong)uVar1 + 1;
      do {
        uVar8 = uVar6 - 1;
        if ((long)uVar8 < 1) {
          uVar8 = 0;
          goto LAB_0014faa5;
        }
        ppuVar5 = __ctype_b_loc();
        lVar2 = uVar6 - 2;
        uVar6 = uVar8;
      } while ((*(byte *)((long)*ppuVar5 + (ulong)puVar7[lVar2] * 2 + 1) & 0x20) != 0);
      if ((int)uVar8 <= iVar3) {
        puVar7 = puVar7 + (uVar8 & 0xffffffff);
LAB_0014faa5:
        *puVar7 = '\0';
      }
      b->slen = (int)uVar8;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int brtrimws (bstring b) {
int i;

	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;

	for (i = b->slen - 1; i >= 0; i--) {
		if (!wspace (b->data[i])) {
			if (b->mlen > i) b->data[i+1] = (unsigned char) '\0';
			b->slen = i + 1;
			return BSTR_OK;
		}
	}

	b->data[0] = (unsigned char) '\0';
	b->slen = 0;
	return BSTR_OK;
}